

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long,std::__cxx11::string>
          (BasicWriter<char> *this,BasicCStringRef<char> arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  uint64_t types;
  ArgList local_80;
  char *local_70;
  undefined1 local_68 [8];
  Type array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  unsigned_long *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  BasicWriter<char> *this_local;
  BasicCStringRef<char> arg0_local;
  
  _local_68 = (StringValue<char>)
              internal::ArgArray<3ul,true>::
              make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>(args);
  array._8_16_ = (undefined1  [16])
                 internal::ArgArray<3ul,true>::
                 make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,unsigned_long>(args_1);
  array._24_16_ =
       (undefined1  [16])
       internal::ArgArray<3ul,true>::
       make<fmt::BasicFormatter<char,fmt::ArgFormatter<char>>,std::__cxx11::string>(args_2);
  local_70 = arg0.data_;
  types = internal::make_type<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                    (args,args_1,args_2);
  ArgList::ArgList(&local_80,types,(Value *)local_68);
  write(this,(int)local_70,(void *)local_80.types_,(size_t)local_80.field_1);
  return;
}

Assistant:

BasicWriter &operator<<(int value)
    {
        write_decimal(value);
        return *this;
    }